

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitArrayNewSeg(FunctionValidator *this,ArrayNewSeg *curr)

{
  Type *this_00;
  bool bVar1;
  DataSegment *pDVar2;
  ElementSegment *pEVar3;
  char *text;
  ValidationInfo *this_01;
  Function *func;
  Type local_38 [2];
  HeapType local_28;
  HeapType heapType;
  
  ValidationInfo::shouldBeTrue<wasm::ArrayNewSeg*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "array.new_{data, elem} requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewSeg*,wasm::Type>
            (this->info,(Type)(curr->offset->type).id,(Type)0x2,curr,
             "array.new_{data, elem} offset must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewSeg*,wasm::Type>
            (this->info,(Type)(curr->size->type).id,(Type)0x2,curr,
             "array.new_{data, elem} size must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if (curr->op == NewElem) {
    pDVar2 = (DataSegment *)
             Module::getElementSegment
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->segment).super_IString.str);
    func = (this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           currFunction;
    this_01 = this->info;
    text = "array.new_elem segment should exist";
  }
  else {
    if (curr->op != NewData) {
      handle_unreachable("unexpected op",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                         ,0xab0);
    }
    pDVar2 = Module::getDataSegment
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->segment).super_IString.str);
    func = (this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           currFunction;
    this_01 = this->info;
    text = "array.new_data segment should exist";
  }
  bVar1 = ValidationInfo::shouldBeTrue<wasm::ArrayNewSeg*>
                    (this_01,pDVar2 != (DataSegment *)0x0,curr,text,func);
  if ((bVar1) &&
     ((curr->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression.type.id != 1)) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression.type;
    bVar1 = wasm::Type::isRef(this_00);
    bVar1 = ValidationInfo::shouldBeTrue<wasm::ArrayNewSeg*>
                      (this->info,bVar1,curr,
                       "array.new_{data, elem} type should be an array reference",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
    if (bVar1) {
      local_28 = wasm::Type::getHeapType(this_00);
      bVar1 = HeapType::isArray(&local_28);
      bVar1 = ValidationInfo::shouldBeTrue<wasm::ArrayNewSeg*>
                        (this->info,bVar1,curr,
                         "array.new_{data, elem} type shoudl be an array reference",
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                         ).
                         super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .
                         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .currFunction);
      if (bVar1) {
        HeapType::getArray((HeapType *)local_38);
        if (curr->op == NewElem) {
          pEVar3 = Module::getElementSegment
                             ((this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .currModule,(Name)(curr->segment).super_IString.str);
          shouldBeSubType(this,(Type)(pEVar3->type).id,local_38[0],(Expression *)curr,
                          "array.new_elem segment type should be a subtype of the result element type"
                         );
        }
        else {
          if (curr->op != NewData) {
            handle_unreachable("unexpected op",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                               ,0xad1);
          }
          ValidationInfo::shouldBeTrue<wasm::ArrayNewSeg*>
                    (this->info,local_38[0].id - 2 < 5,curr,
                     "array.new_data result element type should be numeric",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNewSeg(ArrayNewSeg* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.new_{data, elem} requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->offset->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} size must be an i32");
  switch (curr->op) {
    case NewData:
      if (!shouldBeTrue(getModule()->getDataSegment(curr->segment),
                        curr,
                        "array.new_data segment should exist")) {
        return;
      }
      break;
    case NewElem:
      if (!shouldBeTrue(getModule()->getElementSegment(curr->segment),
                        curr,
                        "array.new_elem segment should exist")) {
        return;
      }
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(
        curr->type.isRef(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(),
        curr,
        "array.new_{data, elem} type shoudl be an array reference")) {
    return;
  }
  auto elemType = heapType.getArray().element.type;
  switch (curr->op) {
    case NewData:
      shouldBeTrue(elemType.isNumber(),
                   curr,
                   "array.new_data result element type should be numeric");
      break;
    case NewElem:
      shouldBeSubType(getModule()->getElementSegment(curr->segment)->type,
                      elemType,
                      curr,
                      "array.new_elem segment type should be a subtype of the "
                      "result element type");
      break;
    default:
      WASM_UNREACHABLE("unexpected op");
  }
}